

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O3

void Js::ByteCodeDumper::
     DumpCallIExtendedFlagsWithICIndex<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
               (OpCode op,
               OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
               *data,FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  AuxArray<unsigned_int> *pAVar1;
  ulong uVar2;
  
  DumpCallI<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
            (op,data,dumpFunction,reader);
  Output::Print(L" <%04x> ",(ulong)data->callFlags);
  DumpCallI<Js::OpLayoutT_CallIExtendedFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
            (op,data,dumpFunction,reader);
  Output::Print(L" <%d> ",
                (ulong)(data->
                       super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                       ).inlineCacheIndex);
  if (((data->super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
       super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Options &
      CallIExtended_SpreadArgs) == CallIExtended_None) {
    return;
  }
  pAVar1 = ByteCodeReader::ReadAuxArray<unsigned_int>
                     ((data->
                      super_OpLayoutT_CallIExtendedWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                      ).super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                      SpreadAuxOffset,dumpFunction);
  Output::Print(L" spreadArgs [",(ulong)pAVar1->count);
  if (pAVar1->count != 0) {
    uVar2 = 0;
    do {
      if (uVar2 != 0) {
        if (uVar2 == 0xb) {
          Output::Print(L", ...");
          break;
        }
        Output::Print(L", ");
      }
      Output::Print(L"%u",(ulong)pAVar1[uVar2 + 1].count);
      uVar2 = uVar2 + 1;
    } while (uVar2 < pAVar1->count);
  }
  Output::Print(L"]");
  return;
}

Assistant:

void ByteCodeDumper::DumpCallIExtendedFlagsWithICIndex(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        DumpCallIFlags(op, data, dumpFunction, reader);
        DumpCallIWithICIndex(op, data, dumpFunction, reader);
        if (data->Options & Js::CallIExtended_SpreadArgs)
        {
            const Js::AuxArray<uint32> *arr = reader.ReadAuxArray<uint32>(data->SpreadAuxOffset, dumpFunction);
            Output::Print(_u(" spreadArgs ["), arr->count);
            for (uint i = 0; i < arr->count; i++)
            {
                if (i > 10)
                {
                    Output::Print(_u(", ..."));
                    break;
                }
                if (i != 0)
                {
                    Output::Print(_u(", "));
                }
                Output::Print(_u("%u"), arr->elements[i]);
            }
            Output::Print(_u("]"));
        }
    }